

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-writer.c
# Opt level: O2

void test_bson_writer_null_realloc_2(void)

{
  char cVar1;
  undefined8 uVar2;
  int iVar3;
  char *pcVar4;
  bool bVar5;
  uint8_t *buf;
  bson_t *b;
  size_t buflen;
  
  buf = (uint8_t *)bson_malloc0(0x20);
  buflen = 0x20;
  uVar2 = bson_writer_new(&buf,&buflen,0,0,0);
  iVar3 = 5;
  do {
    cVar1 = bson_writer_begin(uVar2,&b);
    bVar5 = iVar3 == 0;
    iVar3 = iVar3 + -1;
    if (bVar5) {
      if (cVar1 == '\0') {
        pcVar4 = "bson_writer_begin (writer, &b)";
        uVar2 = 0xae;
      }
      else {
        cVar1 = bson_append_int32(b,"a",0xffffffffffffffff,0x7b);
        if (cVar1 == '\0') {
          bson_writer_end(uVar2);
          iVar3 = bcmp(buf,&DAT_00146d90,0x20);
          if (iVar3 == 0) {
            bson_writer_destroy(uVar2);
            bson_free(buf);
            return;
          }
          pcVar4 = "r == 0";
          uVar2 = 0xb3;
        }
        else {
          pcVar4 = "!bson_append_int32 (b, \"a\", -1, 123)";
          uVar2 = 0xaf;
        }
      }
LAB_0012dbdc:
      fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-writer.c"
              ,uVar2,"test_bson_writer_null_realloc_2",pcVar4);
      abort();
    }
    if (cVar1 == '\0') {
      pcVar4 = "bson_writer_begin (writer, &b)";
      uVar2 = 0xaa;
      goto LAB_0012dbdc;
    }
    bson_writer_end(uVar2);
  } while( true );
}

Assistant:

static void
test_bson_writer_null_realloc_2 (void)
{
   const uint8_t testdata[] = {5, 0, 0, 0, 0, 5, 0, 0, 0, 0, 5, 0, 0, 0, 0, 5,
                               0, 0, 0, 0, 5, 0, 0, 0, 0, 5, 0, 0, 0, 0, 0, 0};
   bson_writer_t *writer;
   uint8_t *buf = bson_malloc0 (32);
   size_t buflen = 32;
   bson_t *b;
   int r;
   int i;

   writer = bson_writer_new (&buf, &buflen, 0, NULL, NULL);
   for (i = 0; i < 5; i++) {
      BSON_ASSERT (bson_writer_begin (writer, &b));
      bson_writer_end (writer);
   }

   BSON_ASSERT (bson_writer_begin (writer, &b));
   BSON_ASSERT (!bson_append_int32 (b, "a", -1, 123));
   bson_writer_end (writer);

   r = memcmp (buf, testdata, 32);
   BSON_ASSERT (r == 0);
   bson_writer_destroy (writer);

   bson_free (buf);
}